

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_embedded_file.cpp
# Opt level: O2

void __thiscall ON_EmbeddedFile::~ON_EmbeddedFile(ON_EmbeddedFile *this)

{
  CImpl *this_00;
  
  (this->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object =
       (_func_int **)&PTR_ClassId_00821488;
  Clear(this);
  this_00 = this->m_impl;
  if (this_00 != (CImpl *)0x0) {
    CImpl::~CImpl(this_00);
  }
  operator_delete(this_00,0x28);
  this->m_impl = (CImpl *)0x0;
  ON_ModelComponent::~ON_ModelComponent(&this->super_ON_ModelComponent);
  return;
}

Assistant:

ON_EmbeddedFile::~ON_EmbeddedFile()
{
  Clear();

  delete m_impl;
  m_impl = nullptr;
}